

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O2

void __thiscall
pstore::error_or<pstore::romfs::directory_const*>::
move_construct<pstore::gsl::not_null<pstore::romfs::directory_const*>>
          (error_or<pstore::romfs::directory_const*> *this,
          error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *rhs)

{
  error_or<pstore::romfs::directory_const*> eVar1;
  error_code *peVar2;
  directory **ppdVar3;
  not_null<const_pstore::romfs::directory_*> *pnVar4;
  error_code eVar5;
  
  eVar1 = (error_or<pstore::romfs::directory_const*>)rhs->has_error_;
  this[0x10] = eVar1;
  if (eVar1 == (error_or<pstore::romfs::directory_const*>)0x1) {
    peVar2 = error_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,std::error_code>
                       ((error_or<const_pstore::romfs::directory_*> *)this);
    eVar5 = error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>::get_error(rhs);
    peVar2->_M_value = eVar5._M_value;
    peVar2->_M_cat = eVar5._M_cat;
  }
  else {
    ppdVar3 = value_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,pstore::romfs::directory_const*>
                        ((error_or<const_pstore::romfs::directory_*> *)this);
    pnVar4 = error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
             value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,pstore::gsl::not_null<pstore::romfs::directory_const*>>
                       (rhs);
    *ppdVar3 = pnVar4->ptr_;
  }
  return;
}

Assistant:

void error_or<T>::move_construct (error_or<Other> && rhs) noexcept {
        has_error_ = rhs.has_error_;
        if (has_error_) {
            new (get_error_storage ()) std::error_code (rhs.get_error ());
        } else {
            new (get_storage ()) storage_type (std::move (*rhs.get_storage ()));
        }
    }